

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unicode_filenames.cc
# Opt level: O1

int copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  FILE *__stream;
  FILE *__s;
  size_t __n;
  ostream *poVar2;
  char buf [10240];
  undefined1 auStack_2818 [10240];
  
  __stream = fopen("minimal.pdf","rb");
  __s = fopen((char *)dst,"wb");
  if ((__stream != (FILE *)0x0) && (__s != (FILE *)0x0)) {
    __n = fread(auStack_2818,1,0x2800,__stream);
    while (__n != 0) {
      fwrite(auStack_2818,1,__n,__s);
      __n = fread(auStack_2818,1,0x2800,__stream);
    }
    fclose(__stream);
    iVar1 = fclose(__s);
    return iVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"errors opening files");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(2);
}

Assistant:

void
copy(char const* outname)
{
    FILE* in = fopen("minimal.pdf", "rb");
    FILE* out = fopen(outname, "wb");
    do_copy(in, out);
}